

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_tracing_register_cb_libapi.cpp
# Opt level: O0

ze_result_t
zelTracerContextGetStatusRegisterCallback
          (zel_tracer_handle_t hTracer,zel_tracer_reg_t callback_type,
          ze_pfnContextGetStatusCb_t pfnGetStatusCb)

{
  code *pcVar1;
  ze_pfnSetCallback_t func;
  ze_pfnContextGetStatusCb_t pfnGetStatusCb_local;
  zel_tracer_reg_t callback_type_local;
  zel_tracer_handle_t hTracer_local;
  
  if (*(long *)(ze_lib::context + 0xd88) == 0) {
    hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    pcVar1 = (code *)dlsym(*(undefined8 *)(ze_lib::context + 0xd88),
                           "zelTracerContextGetStatusRegisterCallback");
    if (pcVar1 == (code *)0x0) {
      hTracer_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    else {
      hTracer_local._4_4_ = (*pcVar1)(hTracer,callback_type,pfnGetStatusCb);
    }
  }
  return hTracer_local._4_4_;
}

Assistant:

ZE_APIEXPORT ze_result_t ZE_APICALL
zelTracerContextGetStatusRegisterCallback(
    zel_tracer_handle_t hTracer,
    zel_tracer_reg_t callback_type,
    ze_pfnContextGetStatusCb_t pfnGetStatusCb
    ) {

    if(!ze_lib::context->tracing_lib)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    typedef ze_result_t (ZE_APICALL *ze_pfnSetCallback_t)(
        zel_tracer_handle_t hTracer,
        zel_tracer_reg_t callback_type,
        ze_pfnContextGetStatusCb_t pfnGetStatusCb
    );

    auto func = reinterpret_cast<ze_pfnSetCallback_t>(
        GET_FUNCTION_PTR(ze_lib::context->tracing_lib, "zelTracerContextGetStatusRegisterCallback") );

    if(func)
        return func(hTracer, callback_type, pfnGetStatusCb);

    return ZE_RESULT_ERROR_UNINITIALIZED;    
}